

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void funcargs(LexState *ls,expdesc *f,int line)

{
  int iVar1;
  FuncState *fs_00;
  int info;
  int local_70;
  int nparams;
  int base;
  expdesc args;
  FuncState *fs;
  int line_local;
  expdesc *f_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  args.ravi_type_map = 0;
  args._36_4_ = 0;
  _nparams = 0;
  args.k = VVOID;
  args._4_4_ = 0;
  args.u.ival = 0;
  args.u.ind.usertype = (TString *)0x0;
  args.t = -1;
  args.f = 0;
  args.usertype = (TString *)0xffffffff;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x28) {
    luaX_next(ls);
    if ((ls->t).token == 0x29) {
      _nparams = _nparams & 0xffffffff00000000;
    }
    else {
      explist(ls,(expdesc *)&nparams);
      luaK_setreturns(fs_00,(expdesc *)&nparams,-1);
    }
    check_match(ls,0x29,0x28,line);
  }
  else if (iVar1 == 0x7b) {
    constructor(ls,(expdesc *)&nparams);
  }
  else {
    if (iVar1 != 0x126) {
      luaX_syntaxerror(ls,"function arguments expected");
    }
    codestring(ls,(expdesc *)&nparams,(ls->t).seminfo.ts);
    luaX_next(ls);
  }
  if (f->k == VNONRELOC) {
    iVar1 = (f->u).info;
    if ((nparams == 0xd) || (nparams == 0xe)) {
      local_70 = -1;
    }
    else {
      if (nparams != 0) {
        luaK_exp2nextreg(fs_00,(expdesc *)&nparams);
      }
      local_70 = (uint)fs_00->freereg - (iVar1 + 1);
    }
    info = luaK_codeABC(fs_00,OP_CALL,iVar1,local_70 + 1,2);
    init_exp(f,VCALL,info,0xffffffff,(TString *)0x0);
    luaK_fixline(fs_00,line);
    fs_00->freereg = (char)iVar1 + '\x01';
    return;
  }
  __assert_fail("f->k == VNONRELOC",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                ,0x616,"void funcargs(LexState *, expdesc *, int)");
}

Assistant:

static void funcargs (LexState *ls, expdesc *f, int line) {
  FuncState *fs = ls->fs;
  expdesc args = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  int base, nparams;
  switch (ls->t.token) {
    case '(': {  /* funcargs -> '(' [ explist ] ')' */
      luaX_next(ls);
      if (ls->t.token == ')')  /* arg list is empty? */
        args.k = VVOID;
      else {
        explist(ls, &args);
        luaK_setmultret(fs, &args);
      }
      check_match(ls, ')', '(', line);
      break;
    }
    case '{': {  /* funcargs -> constructor */
      constructor(ls, &args);
      break;
    }
    case TK_STRING: {  /* funcargs -> STRING */
      codestring(ls, &args, ls->t.seminfo.ts);
      luaX_next(ls);  /* must use 'seminfo' before 'next' */
      break;
    }
    default: {
      luaX_syntaxerror(ls, "function arguments expected");
    }
  }
  lua_assert(f->k == VNONRELOC);
  base = f->u.info;  /* base register for call */
  if (hasmultret(args.k))
    nparams = LUA_MULTRET;  /* open call */
  else {
    if (args.k != VVOID)
      luaK_exp2nextreg(fs, &args);  /* close last argument */
    nparams = fs->freereg - (base+1);
  }
  init_exp(f, VCALL, luaK_codeABC(fs, OP_CALL, base, nparams + 1, 2), RAVI_TM_ANY, NULL); /* RAVI TODO return value from function call not known */
  luaK_fixline(fs, line);
  fs->freereg = base+1;  /* call remove function and arguments and leaves
                            (unless changed) one result */
}